

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O2

void __thiscall ImPlotPlot::ImPlotPlot(ImPlotPlot *this)

{
  long lVar1;
  
  ImPlotAxis::ImPlotAxis(&this->XAxis);
  lVar1 = 0;
  do {
    ImPlotAxis::ImPlotAxis((ImPlotAxis *)((long)&this->YAxis[0].Flags + lVar1));
    lVar1 = lVar1 + 0x80;
  } while (lVar1 != 0x180);
  this->Flags = 0;
  this->PreviousFlags = 0;
  (this->XAxis).Orientation = 0;
  (this->LegendData).Indices.Size = 0;
  (this->LegendData).Indices.Capacity = 0;
  (this->LegendData).Indices.Data = (int *)0x0;
  (this->LegendData).Labels.Buf.Size = 0;
  (this->LegendData).Labels.Buf.Capacity = 0;
  (this->LegendData).Labels.Buf.Data = (char *)0x0;
  (this->Items).Buf.Size = 0;
  (this->Items).Buf.Capacity = 0;
  (this->Items).Buf.Data = (ImPlotItem *)0x0;
  (this->Items).Map.Data.Size = 0;
  (this->Items).Map.Data.Capacity = 0;
  (this->Items).Map.Data.Data = (ImGuiStoragePair *)0x0;
  (this->Items).FreeIdx = 0;
  (this->Items).AliveCount = 0;
  (this->SelectStart).x = 0.0;
  (this->SelectStart).y = 0.0;
  (this->QueryRect).Max.x = 0.0;
  (this->QueryRect).Max.y = 0.0;
  (this->SelectRect).Min.x = 0.0;
  (this->SelectRect).Min.y = 0.0;
  (this->SelectRect).Max.x = 0.0;
  (this->SelectRect).Max.y = 0.0;
  (this->QueryStart).x = 0.0;
  (this->QueryStart).y = 0.0;
  (this->QueryRect).Min.x = 0.0;
  (this->QueryRect).Min.y = 0.0;
  (this->FrameRect).Min.x = 0.0;
  (this->FrameRect).Min.y = 0.0;
  (this->FrameRect).Max.x = 0.0;
  (this->FrameRect).Max.y = 0.0;
  (this->CanvasRect).Min.x = 0.0;
  (this->CanvasRect).Min.y = 0.0;
  (this->CanvasRect).Max.x = 0.0;
  (this->CanvasRect).Max.y = 0.0;
  (this->PlotRect).Min.x = 0.0;
  (this->PlotRect).Min.y = 0.0;
  (this->PlotRect).Max.x = 0.0;
  (this->PlotRect).Max.y = 0.0;
  (this->AxesRect).Min.x = 0.0;
  (this->AxesRect).Min.y = 0.0;
  (this->AxesRect).Max.x = 0.0;
  (this->AxesRect).Max.y = 0.0;
  (this->LegendRect).Min.x = 0.0;
  (this->LegendRect).Min.y = 0.0;
  (this->LegendRect).Max.x = 0.0;
  (this->LegendRect).Max.y = 0.0;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x80) {
    *(undefined4 *)((long)&this->YAxis[0].Orientation + lVar1) = 1;
  }
  (this->QueryStart).x = 0.0;
  (this->QueryStart).y = 0.0;
  (this->SelectStart).x = 0.0;
  (this->SelectStart).y = 0.0;
  this->Initialized = false;
  this->Selecting = false;
  this->Selected = false;
  this->ContextLocked = false;
  this->Querying = false;
  this->Queried = false;
  this->DraggingQuery = false;
  this->LegendHovered = false;
  this->LegendOutside = false;
  this->LegendFlipSideNextFrame = false;
  this->LegendOrientation = 1;
  this->ColormapIdx = 0;
  this->CurrentYAxis = 0;
  this->MousePosLocation = 10;
  this->LegendLocation = 5;
  return;
}

Assistant:

ImPlotPlot() {
        Flags             = PreviousFlags = ImPlotFlags_None;
        XAxis.Orientation = ImPlotOrientation_Horizontal;
        for (int i = 0; i < IMPLOT_Y_AXES; ++i)
            YAxis[i].Orientation = ImPlotOrientation_Vertical;
        SelectStart       = QueryStart = ImVec2(0,0);
        Initialized       = Selecting = Selected = ContextLocked = Querying = Queried = DraggingQuery = LegendHovered = LegendOutside = LegendFlipSideNextFrame = false;
        ColormapIdx       = CurrentYAxis = 0;
        LegendLocation    = ImPlotLocation_North | ImPlotLocation_West;
        LegendOrientation = ImPlotOrientation_Vertical;
        MousePosLocation  = ImPlotLocation_South | ImPlotLocation_East;
    }